

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ArrayPtr<const_char> kj::_::safeUnixPath(sockaddr_un *addr,uint addrlen)

{
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_char> AVar3;
  size_t local_c8;
  size_t pathlen;
  size_t maxPathlen;
  Fault f_1;
  uint *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition_1;
  Fault local_68;
  Fault f;
  unsigned_short *local_58;
  undefined1 local_50 [8];
  DebugComparison<const_unsigned_short_&,_int> _kjCondition;
  uint addrlen_local;
  sockaddr_un *addr_local;
  
  _kjCondition._36_4_ = addrlen;
  local_58 = (unsigned_short *)
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&MAGIC_ASSERT,&addr->sun_family);
  f.exception._4_4_ = 1;
  DebugExpression<unsigned_short_const&>::operator==
            ((DebugComparison<const_unsigned_short_&,_int> *)local_50,
             (DebugExpression<unsigned_short_const&> *)&local_58,(int *)((long)&f.exception + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short_const&,int>&,char_const(&)[19]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xbaa,FAILED,"addr->sun_family == AF_UNIX","_kjCondition,\"not a unix address\"",
               (DebugComparison<const_unsigned_short_&,_int> *)local_50,
               (char (*) [19])"not a unix address");
    Debug::Fault::fatal(&local_68);
  }
  local_a8 = (uint *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f_1.exception = (Exception *)0x2;
  DebugExpression<unsigned_int&>::operator>=
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_a0,
             (DebugExpression<unsigned_int&> *)&local_a8,(unsigned_long *)&f_1);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[21]>
              ((Fault *)&maxPathlen,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xbab,FAILED,"addrlen >= offsetof(sockaddr_un, sun_path)",
               "_kjCondition,\"invalid unix address\"",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_a0,
               (char (*) [21])"invalid unix address");
    Debug::Fault::fatal((Fault *)&maxPathlen);
  }
  sVar2 = (ulong)(uint)_kjCondition._36_4_ - 2;
  if ((sVar2 == 0) || (addr->sun_path[0] != '\0')) {
    local_c8 = strnlen(addr->sun_path,sVar2);
  }
  else {
    sVar2 = strnlen(addr->sun_path + 1,(ulong)(uint)_kjCondition._36_4_ - 3);
    local_c8 = sVar2 + 1;
  }
  AVar3 = arrayPtr<char_const>(addr->sun_path,local_c8);
  return AVar3;
}

Assistant:

kj::ArrayPtr<const char> safeUnixPath(const struct sockaddr_un* addr, uint addrlen) {
  KJ_REQUIRE(addr->sun_family == AF_UNIX, "not a unix address");
  KJ_REQUIRE(addrlen >= offsetof(sockaddr_un, sun_path), "invalid unix address");

  size_t maxPathlen = addrlen - offsetof(sockaddr_un, sun_path);

  size_t pathlen;
  if (maxPathlen > 0 && addr->sun_path[0] == '\0') {
    // Linux "abstract" unix address
    pathlen = strnlen(addr->sun_path + 1, maxPathlen - 1) + 1;
  } else {
    pathlen = strnlen(addr->sun_path, maxPathlen);
  }
  return kj::arrayPtr(addr->sun_path, pathlen);
}